

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

string * __thiscall
flatbuffers::GetAnyFieldS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,Table *table,Field *field,Schema *schema
          )

{
  uint8_t *puVar1;
  uint8_t *data;
  uint16_t field_00;
  BaseType BVar2;
  Type *pTVar3;
  char *pcVar4;
  int __c;
  int in_R9D;
  allocator<char> local_31;
  uint8_t *local_30;
  uint8_t *field_ptr;
  Schema *schema_local;
  Field *field_local;
  Table *table_local;
  
  field_ptr = (uint8_t *)field;
  schema_local = (Schema *)table;
  field_local = (Field *)this;
  table_local = (Table *)__return_storage_ptr__;
  field_00 = reflection::Field::offset((Field *)table);
  pcVar4 = (char *)(ulong)field_00;
  local_30 = Table::GetAddressOf((Table *)this,field_00);
  if (local_30 == (uint8_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    pTVar3 = reflection::Field::type((Field *)schema_local);
    BVar2 = reflection::Type::base_type(pTVar3);
    data = field_ptr;
    puVar1 = local_30;
    pTVar3 = reflection::Field::type((Field *)schema_local);
    pcVar4 = reflection::Type::index(pTVar3,pcVar4,__c);
    GetAnyValueS_abi_cxx11_
              (__return_storage_ptr__,(flatbuffers *)(ulong)BVar2,(BaseType)puVar1,data,
               (Schema *)((ulong)pcVar4 & 0xffffffff),in_R9D);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetAnyFieldS(const Table &table,
                                const reflection::Field &field,
                                const reflection::Schema *schema) {
  auto field_ptr = table.GetAddressOf(field.offset());
  return field_ptr ? GetAnyValueS(field.type()->base_type(), field_ptr, schema,
                                  field.type()->index())
                   : "";
}